

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

ON_ClippingPlaneInfo * __thiscall
ON_ClippingPlane::ClippingPlaneInfo
          (ON_ClippingPlaneInfo *__return_storage_ptr__,ON_ClippingPlane *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  
  ON_ClippingPlaneInfo::ON_ClippingPlaneInfo(__return_storage_ptr__);
  dVar1 = (this->m_plane).plane_equation.x;
  dVar2 = (this->m_plane).plane_equation.y;
  dVar3 = (this->m_plane).plane_equation.d;
  (__return_storage_ptr__->m_plane_equation).z = (this->m_plane).plane_equation.z;
  (__return_storage_ptr__->m_plane_equation).d = dVar3;
  (__return_storage_ptr__->m_plane_equation).x = dVar1;
  (__return_storage_ptr__->m_plane_equation).y = dVar2;
  uVar5 = (this->m_plane_id).Data2;
  uVar6 = (this->m_plane_id).Data3;
  uVar4 = *(undefined8 *)(this->m_plane_id).Data4;
  (__return_storage_ptr__->m_plane_id).Data1 = (this->m_plane_id).Data1;
  (__return_storage_ptr__->m_plane_id).Data2 = uVar5;
  (__return_storage_ptr__->m_plane_id).Data3 = uVar6;
  *(undefined8 *)(__return_storage_ptr__->m_plane_id).Data4 = uVar4;
  __return_storage_ptr__->m_bEnabled = this->m_bEnabled;
  dVar1 = Depth(this);
  if (0.0 <= dVar1) {
    __return_storage_ptr__->m_depth = (float)dVar1;
  }
  __return_storage_ptr__->m_depth_enabled = this->m_depth_enabled;
  return __return_storage_ptr__;
}

Assistant:

ON_ClippingPlaneInfo ON_ClippingPlane::ClippingPlaneInfo() const
{
  ON_ClippingPlaneInfo info;
  info.m_plane_equation = m_plane.plane_equation;
  info.m_plane_id = m_plane_id;
  info.m_bEnabled = m_bEnabled;
  info.SetDepth(Depth());
  info.SetDepthEnabled(m_depth_enabled);
  return info;
}